

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.cxx
# Opt level: O3

void deleteVariableWatchCallbackData(void *client_data)

{
  if (client_data != (void *)0x0) {
    if (*(long **)((long)client_data + 8) != (long *)((long)client_data + 0x18)) {
      operator_delete(*(long **)((long)client_data + 8),*(long *)((long)client_data + 0x18) + 1);
    }
  }
  operator_delete(client_data,0x28);
  return;
}

Assistant:

static void deleteVariableWatchCallbackData(void* client_data)
{
  cmVariableWatchCallbackData* data =
    static_cast<cmVariableWatchCallbackData*>(client_data);
  delete data;
}